

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::testCase(FunctionalTest20_21 *this,GLuint *bit_field)

{
  ostringstream *this_00;
  ulong uVar1;
  bool bVar2;
  subroutineUniformSet *psVar3;
  subroutineUniformSet *this_01;
  GLuint i;
  long lVar4;
  ulong uVar5;
  subroutineUniformSet subroutine_indices [5];
  subroutineUniformSet captured_subroutine_indices [5];
  subroutineUniformSet local_288;
  subroutineUniformSet local_274 [4];
  subroutineUniformSet local_218;
  subroutineUniformSet asStack_204 [4];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  this_01 = &local_288;
  psVar3 = &local_288;
  lVar4 = 0;
  do {
    subroutineUniformSet::set(this_01,bit_field[lVar4],this->m_subroutine_indices);
    lVar4 = lVar4 + 1;
    this_01 = this_01 + 1;
  } while (lVar4 != 5);
  lVar4 = 0x12;
  do {
    (**(code **)(**(long **)(this->m_program_pipelines + lVar4 * 2 + -0x1e) + 0x40))();
    updateCurrentSubroutineSet(this,psVar3);
    lVar4 = lVar4 + 1;
    psVar3 = psVar3 + 1;
  } while (lVar4 != 0x16);
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[8])();
  updateCurrentSubroutineSet(this,local_274 + 3);
  lVar4 = 0x12;
  psVar3 = &local_218;
  do {
    (**(code **)(**(long **)(this->m_program_pipelines + lVar4 * 2 + -0x1e) + 0x40))();
    captureCurrentSubroutineSet(this,psVar3);
    lVar4 = lVar4 + 1;
    psVar3 = psVar3 + 1;
  } while (lVar4 != 0x16);
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[8])();
  captureCurrentSubroutineSet(this,asStack_204 + 3);
  bVar2 = subroutineUniformSet::operator!=(&local_288,&local_218);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    lVar4 = 0;
    uVar1 = 0;
    do {
      uVar5 = uVar1;
      if (lVar4 == 0x50) {
        return 3 < uVar5;
      }
      bVar2 = subroutineUniformSet::operator!=
                        ((subroutineUniformSet *)((long)&local_274[0].m_vertex_shader_stage + lVar4)
                         ,(subroutineUniformSet *)
                          ((long)&asStack_204[0].m_vertex_shader_stage + lVar4));
      lVar4 = lVar4 + 0x14;
      uVar1 = uVar5 + 1;
    } while (!bVar2);
    bVar2 = 3 < uVar5;
  }
  local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Error.",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Context: ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," VS, expected: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," captured: ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," TCS, expected: ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," captured: ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," TES, expected: ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," captured: ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," GS, expected: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," captured: ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," FS, expected: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," captured: ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  return bVar2;
}

Assistant:

bool FunctionalTest20_21::testCase(const glw::GLuint bit_field[5])
{
	/* Storage for subroutine indices */
	subroutineUniformSet captured_subroutine_indices[m_n_shared_contexts + 1];
	subroutineUniformSet subroutine_indices[m_n_shared_contexts + 1];

	/* Prepare subroutine_indices with bit fields */
	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		subroutine_indices[i].set(bit_field[i], m_subroutine_indices);
	};

	/* Update subroutine uniforms, each context gets different set */
	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		m_shared_contexts[i]->makeCurrent();
		updateCurrentSubroutineSet(subroutine_indices[i]);
	}

	m_context.getRenderContext().makeCurrent();
	updateCurrentSubroutineSet(subroutine_indices[m_n_shared_contexts]);

	/* Capture subroutine uniforms */
	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		m_shared_contexts[i]->makeCurrent();
		captureCurrentSubroutineSet(captured_subroutine_indices[i]);
	}

	m_context.getRenderContext().makeCurrent();
	captureCurrentSubroutineSet(captured_subroutine_indices[m_n_shared_contexts]);

	/* Verify that captured uniforms match expected values */
	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		if (subroutine_indices[i] != captured_subroutine_indices[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Error."
				<< " Context: " << i << " VS, expected: " << subroutine_indices[i].m_vertex_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_vertex_shader_stage
				<< " TCS, expected: " << subroutine_indices[i].m_tesselation_control_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_tesselation_control_shader_stage
				<< " TES, expected: " << subroutine_indices[i].m_tesselation_evaluation_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_tesselation_evaluation_shader_stage
				<< " GS, expected: " << subroutine_indices[i].m_geometry_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_geometry_shader_stage
				<< " FS, expected: " << subroutine_indices[i].m_fragment_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_fragment_shader_stage << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}